

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O0

int rops_destroy_role_h2(lws *wsi)

{
  lws_context *plVar1;
  long lVar2;
  undefined8 *local_20;
  allocated_headers *ah;
  lws_context_per_thread *pt;
  lws *wsi_local;
  
  plVar1 = wsi->context;
  lVar2 = (long)(int)wsi->tsi * 0x188;
  _lws_log(8,"%s: wsi %p: ah det due to close\n","rops_destroy_role_h2",wsi);
  __lws_header_table_detach(wsi,0);
  local_20 = *(undefined8 **)((long)&plVar1->set + lVar2 + -0x78);
  do {
    if (local_20 == (undefined8 *)0x0) {
LAB_001480dd:
      if ((((*(ulong *)&wsi->field_0x2dc >> 2 & 1) != 0) ||
          ((*(ulong *)&wsi->field_0x2dc >> 1 & 1) != 0)) &&
         (lws_hpack_destroy_dynamic_header(wsi), (wsi->h2).h2n != (lws_h2_netconn *)0x0)) {
        lws_realloc((wsi->h2).h2n,0,"free");
        (wsi->h2).h2n = (lws_h2_netconn *)0x0;
      }
      return 0;
    }
    if ((*(char *)((long)local_20 + 0x3c2) != '\0') && ((lws *)local_20[1] == wsi)) {
      _lws_log(1,"%s: ah leak: wsi %p\n","rops_destroy_role_h2",wsi);
      *(undefined1 *)((long)local_20 + 0x3c2) = 0;
      local_20[1] = 0;
      *(int *)((long)&plVar1->set + lVar2 + -0x60) =
           *(int *)((long)&plVar1->set + lVar2 + -0x60) + -1;
      goto LAB_001480dd;
    }
    local_20 = (undefined8 *)*local_20;
  } while( true );
}

Assistant:

static int
rops_destroy_role_h2(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	struct allocated_headers *ah;

	/* we may not have an ah, but may be on the waiting list... */
	lwsl_info("%s: wsi %p: ah det due to close\n", __func__, wsi);
	__lws_header_table_detach(wsi, 0);

	ah = pt->http.ah_list;

	while (ah) {
		if (ah->in_use && ah->wsi == wsi) {
			lwsl_err("%s: ah leak: wsi %p\n", __func__, wsi);
			ah->in_use = 0;
			ah->wsi = NULL;
			pt->http.ah_count_in_use--;
			break;
		}
		ah = ah->next;
	}

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	lws_http_compression_destroy(wsi);
#endif

	if (wsi->upgraded_to_http2 || wsi->mux_substream) {
		lws_hpack_destroy_dynamic_header(wsi);

		if (wsi->h2.h2n)
			lws_free_set_NULL(wsi->h2.h2n);
	}

	return 0;
}